

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

ps_latlink_t * ps_lattice_traverse_next(ps_lattice_t *dag,ps_latnode_t *end)

{
  anon_union_8_4_397b8dde_for_info *paVar1;
  ps_latnode_s *ppVar2;
  latlink_list_t *plVar3;
  ps_latlink_t *ppVar4;
  latlink_list_t **pplVar5;
  
  ppVar4 = ps_lattice_popq(dag);
  if (ppVar4 != (ps_latlink_t *)0x0) {
    paVar1 = &ppVar4->to->info;
    paVar1->fanin = paVar1->fanin + -1;
    ppVar2 = ppVar4->to;
    if ((ppVar2->info).fanin == 0) {
      if (end == (ps_latnode_t *)0x0) {
        end = dag->end;
      }
      if (ppVar2 == end) {
        ps_lattice_delq(dag);
      }
      else {
        pplVar5 = &ppVar2->exits;
        while (plVar3 = *pplVar5, plVar3 != (latlink_list_t *)0x0) {
          ps_lattice_pushq(dag,plVar3->link);
          pplVar5 = &plVar3->next;
        }
      }
    }
  }
  return ppVar4;
}

Assistant:

ps_latlink_t *
ps_lattice_traverse_next(ps_lattice_t *dag, ps_latnode_t *end)
{
    ps_latlink_t *next;

    next = ps_lattice_popq(dag);
    if (next == NULL)
        return NULL;

    /* Decrease fanin count for destination node and expand outgoing
     * edges if all incoming edges have been seen. */
    --next->to->info.fanin;
    if (next->to->info.fanin == 0) {
        latlink_list_t *x;

        if (end == NULL) end = dag->end;
        if (next->to == end) {
            /* If we have traversed all links entering the end node,
             * clear the queue, causing future calls to this function
             * to return NULL. */
            ps_lattice_delq(dag);
            return next;
        }

        /* Extend all outgoing edges. */
        for (x = next->to->exits; x; x = x->next)
            ps_lattice_pushq(dag, x->link);
    }
    return next;
}